

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::~Molecule(Molecule *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Molecule_0046b2b0;
  Utils::deletePointers<std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>(unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>>
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>>
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>>
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>>
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>>
            ((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>>
            ((vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_> *)unaff_retaddr)
  ;
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>
            ((vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>>
            ((vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>>
            ((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              *)unaff_retaddr);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x2c3498);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::clear
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x2c34a9);
  PropertyMap::~PropertyMap((PropertyMap *)0x2c34ba);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector(unaff_retaddr);
  std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>::
  ~vector((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_> *
          )unaff_retaddr);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector(unaff_retaddr);
  std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::~vector
            ((vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::~vector
            ((vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::~vector
            ((vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_> *)unaff_retaddr)
  ;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)unaff_retaddr)
  ;
  std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::~vector
            ((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::~vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::~vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::~vector
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::~vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

Molecule::~Molecule() {
    Utils::deletePointers(atoms_);
    Utils::deletePointers(bonds_);
    Utils::deletePointers(bends_);
    Utils::deletePointers(torsions_);
    Utils::deletePointers(inversions_);
    Utils::deletePointers(rigidBodies_);
    Utils::deletePointers(cutoffGroups_);
    Utils::deletePointers(constraintPairs_);
    Utils::deletePointers(constraintElems_);
    Utils::deletePointers(hBondDonors_);

    // integrableObjects_ don't own the objects
    integrableObjects_.clear();
    fluctuatingCharges_.clear();
  }